

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

_Bool container_contains_range
                (container_t *c,uint32_t range_start,uint32_t range_end,uint8_t typecode)

{
  long lVar1;
  ushort uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  undefined7 in_register_00000009;
  ushort uVar6;
  int iVar7;
  ulong uVar8;
  ushort *puVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  
  uVar12 = (uint)CONCAT71(in_register_00000009,typecode);
  if (uVar12 == 4) {
    uVar12 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  uVar6 = (ushort)range_start;
  if ((char)uVar12 == '\x03') {
    iVar5 = *c;
    iVar7 = 0;
    uVar12 = 0;
    if (0 < iVar5) {
      lVar3 = *(long *)((long)c + 8);
      iVar13 = iVar5 + -1;
      do {
        uVar12 = (uint)(iVar13 + iVar7) >> 1;
        uVar8 = (ulong)uVar12;
        uVar2 = *(ushort *)(lVar3 + uVar8 * 4);
        if (uVar2 < uVar6) {
          iVar7 = uVar12 + 1;
        }
        else {
          if (uVar2 <= uVar6) goto LAB_0010b0d0;
          iVar13 = uVar12 - 1;
        }
      } while (iVar7 <= iVar13);
      if ((iVar7 == 0) ||
         (uVar12 = iVar7 - 1, uVar8 = (ulong)uVar12,
         (uint)*(ushort *)(lVar3 + 2 + (ulong)uVar12 * 4) <
         range_start - *(ushort *)(lVar3 + (ulong)uVar12 * 4))) {
        return false;
      }
LAB_0010b0d0:
      uVar12 = 0;
      if ((int)uVar8 < iVar5) {
        puVar9 = (ushort *)(lVar3 + uVar8 * 4 + 2);
        uVar12 = 0;
        do {
          uVar6 = puVar9[-1];
          if (range_end <= uVar6) break;
          uVar2 = *puVar9;
          if (range_end <= (uint)uVar2 + (uint)uVar6) {
            uVar12 = (uVar12 + range_end) - (uint)uVar6;
            break;
          }
          uVar11 = ((uint)uVar2 + (uint)uVar6) - range_start;
          if (uVar2 <= uVar11) {
            uVar11 = (uint)uVar2;
          }
          uVar12 = uVar12 + uVar11;
          uVar11 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar11;
          puVar9 = puVar9 + 2;
        } while ((int)uVar11 < iVar5);
      }
      return ~range_start + range_end <= uVar12;
    }
  }
  else if ((uVar12 & 0xff) == 2) {
    iVar5 = range_end - range_start;
    if (iVar5 == 0 || (int)range_end < (int)range_start) {
      return true;
    }
    iVar7 = *c;
    uVar12 = 0;
    if (iVar5 <= iVar7) {
      iVar13 = iVar7 + -1;
      do {
        uVar11 = iVar13 + uVar12 >> 1;
        uVar2 = *(ushort *)(*(long *)((long)c + 8) + (ulong)(iVar13 + uVar12 & 0xfffffffe));
        if (uVar2 < uVar6) {
          uVar12 = uVar11 + 1;
        }
        else {
          if (uVar2 <= uVar6) {
            if (iVar7 < (int)(uVar11 + iVar5)) {
              return false;
            }
            bVar15 = *(short *)(*(long *)((long)c + 8) + -2 + (ulong)(uVar11 + iVar5) * 2) ==
                     (short)((short)range_end + -1);
            goto LAB_0010b15d;
          }
          iVar13 = uVar11 - 1;
        }
        if (iVar13 < (int)uVar12) {
          return false;
        }
      } while( true );
    }
  }
  else {
    uVar10 = (ulong)(range_start >> 6);
    uVar14 = -1L << ((byte)range_start & 0x3f);
    uVar4 = -1L << ((byte)range_end & 0x3f);
    uVar11 = range_end >> 6;
    lVar3 = *(long *)((long)c + 8);
    uVar8 = *(ulong *)(lVar3 + uVar10 * 8);
    if (range_start >> 6 == uVar11) {
      bVar15 = (uVar14 & ~(uVar8 | uVar4)) == 0;
LAB_0010b15d:
      uVar12 = (uint)bVar15;
    }
    else {
      if (uVar8 < uVar14) {
        return false;
      }
      if ((range_end < 0x10000) &&
         ((uVar4 | *(ulong *)(lVar3 + (ulong)uVar11 * 8)) != 0xffffffffffffffff)) {
        return false;
      }
      do {
        bVar15 = (ulong)uVar11 <= uVar10 + 1 || 0x3fe < uVar10;
        uVar12 = (uint)bVar15;
        if (bVar15) break;
        lVar1 = uVar10 * 8;
        uVar10 = uVar10 + 1;
      } while (*(long *)(lVar3 + 8 + lVar1) == -1);
    }
  }
  return SUB41(uVar12,0);
}

Assistant:

static inline bool container_contains_range(
    const container_t *c, uint32_t range_start, uint32_t range_end,
    uint8_t typecode  // !!! should be second argument?
) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_get_range(const_CAST_bitset(c), range_start,
                                              range_end);
        case ARRAY_CONTAINER_TYPE:
            return array_container_contains_range(const_CAST_array(c),
                                                  range_start, range_end);
        case RUN_CONTAINER_TYPE:
            return run_container_contains_range(const_CAST_run(c), range_start,
                                                range_end);
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}